

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamReader::setDevice(QXmlStreamReader *this,QIODevice *device)

{
  QXmlStreamReaderPrivate *this_00;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *ctx;
  QXmlStreamReaderPrivate *d;
  
  ctx = in_RSI;
  this_00 = d_func((QXmlStreamReader *)0x64677c);
  if ((this_00->deleteDevice & 1U) != 0) {
    if (this_00->device != (QIODevice *)0x0) {
      (*(this_00->device->super_QObject)._vptr_QObject[4])();
    }
    this_00->deleteDevice = false;
  }
  this_00->device = (QIODevice *)in_RSI;
  QXmlStreamReaderPrivate::init(this_00,ctx);
  return;
}

Assistant:

void QXmlStreamReader::setDevice(QIODevice *device)
{
    Q_D(QXmlStreamReader);
    if (d->deleteDevice) {
        delete d->device;
        d->deleteDevice = false;
    }
    d->device = device;
    d->init();

}